

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int Get_TopK<4u>(HashMap<4U> *mp,int k)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  ulong uVar4;
  void *pvVar5;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> __last;
  pointer ppVar6;
  int in_ESI;
  int iVar7;
  int ret;
  iterator it;
  int pos;
  int *num;
  int size;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffffa8;
  _Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *in_stack_ffffffffffffffb0;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_38;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> __nth;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar8;
  
  sVar3 = std::
          unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
          ::size((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                  *)0x1105e7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(int)sVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  iVar8 = 0;
  std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x110628);
  __last._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  __nth._M_cur = __last._M_cur;
  while( true ) {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_ffffffffffffffa8);
    bVar2 = std::__detail::operator!=
                      ((_Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> *)
                       &stack0xffffffffffffffd8,&local_38);
    if (!bVar2) break;
    ppVar6 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11066f);
    iVar7 = iVar8 + 1;
    *(int *)((long)pvVar5 + (long)iVar8 * 4) = ppVar6->second;
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffffb0);
    iVar8 = iVar7;
  }
  std::nth_element<int*>
            ((int *)CONCAT44(iVar8,in_stack_ffffffffffffffe0),(int *)__nth._M_cur,
             (int *)__last._M_cur);
  iVar8 = *(int *)((long)pvVar5 + (long)((int)sVar3 - in_ESI) * 4);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,4);
  }
  return iVar8;
}

Assistant:

int Get_TopK(HashMap<DATA_LEN> mp, int k) {
	int size = mp.size();
	int* num = new int[size];
	int pos = 0;
	typename HashMap<DATA_LEN>::iterator it;
	for (it = mp.begin(); it != mp.end(); ++it) {
		num[pos++] = it->second;
	}
	nth_element(num, num + size - k, num + size);
	int ret = num[size - k];
	delete num;
	return ret;
}